

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O2

void __thiscall
so_5::disp::reuse::work_thread::details::
common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
::common_data_t(common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                *this,lock_factory_t *queue_lock_factory)

{
  long *in_RAX;
  pointer *__ptr;
  undefined8 local_18;
  
  (this->m_thread)._M_id._M_thread = 0;
  (this->m_status)._M_i = stopped;
  local_18 = in_RAX;
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::operator()((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)&stack0xffffffffffffffe8);
  demand_queue_details::
  queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
  ::queue_template_t(&this->m_queue,(lock_unique_ptr_t *)&stack0xffffffffffffffe8);
  if ((long *)local_18 != (long *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  (this->m_thread_id)._M_thread = 0;
  (this->m_demands_count).super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

common_data_t(
		queue_traits::lock_factory_t queue_lock_factory )
		:	m_queue( queue_lock_factory() )
	{}